

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shrink-explosion-protection.cpp
# Opt level: O0

void checkShrinkExplosions_PairIntegral<long>(void)

{
  initializer_list<long> __l;
  bool bVar1;
  pair<long,_long> pVar2;
  long b;
  iterator __end0_1;
  iterator __begin0_1;
  vector<long,_std::allocator<long>_> *__range2;
  long a;
  iterator __end0;
  iterator __begin0;
  vector<long,_std::allocator<long>_> *__range1;
  vector<long,_std::allocator<long>_> fixtures;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffef8;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *in_stack_ffffffffffffff00;
  vector<long,_std::allocator<long>_> *this;
  allocator_type *in_stack_ffffffffffffff28;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff30;
  iterator in_stack_ffffffffffffff38;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> in_stack_ffffffffffffff40;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_a0;
  undefined1 *local_98;
  undefined1 local_79 [25];
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 local_18 [24];
  
  local_48 = 0xffffffffffffea4d;
  uStack_40 = 0x8000000000000000;
  local_58 = 100;
  uStack_50 = 0x15b3;
  local_79._17_8_ = 3;
  uStack_60 = 0xfffffffffffffffd;
  local_79._1_8_ = 1;
  local_79._9_8_ = 0xffffffffffffffff;
  local_38 = 0x7fffffffffffffff;
  local_28 = local_79 + 1;
  local_20 = 9;
  this = (vector<long,_std::allocator<long>_> *)local_79;
  Catch::clara::std::allocator<long>::allocator((allocator<long> *)0x40d513);
  __l._M_len = (size_type)in_stack_ffffffffffffff40._M_current;
  __l._M_array = in_stack_ffffffffffffff38;
  std::vector<long,_std::allocator<long>_>::vector
            (in_stack_ffffffffffffff30,__l,in_stack_ffffffffffffff28);
  Catch::clara::std::allocator<long>::~allocator((allocator<long> *)0x40d544);
  local_98 = local_18;
  local_a0._M_current =
       (long *)std::vector<long,_std::allocator<long>_>::begin(in_stack_fffffffffffffef8);
  std::vector<long,_std::allocator<long>_>::end(in_stack_fffffffffffffef8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff00,
                       (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                       in_stack_fffffffffffffef8);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator*
              (&local_a0);
    std::vector<long,_std::allocator<long>_>::begin(in_stack_fffffffffffffef8);
    std::vector<long,_std::allocator<long>_>::end(in_stack_fffffffffffffef8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffff00,
                         (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                         in_stack_fffffffffffffef8);
      if (!bVar1) break;
      __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator*
                ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                 &stack0xffffffffffffff40);
      pVar2 = std::make_pair<long&,long&>
                        ((long *)in_stack_ffffffffffffff00,(long *)in_stack_fffffffffffffef8);
      in_stack_ffffffffffffff00 =
           (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)pVar2.second;
      checkShrinkExplosions<std::pair<long,long>,checkShrinkExplosions_PairIntegral<long>()::_lambda(std::pair<long,long>)_1_,1000,1000>
                (pVar2.first,in_stack_ffffffffffffff00);
      __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                 &stack0xffffffffffffff40);
    }
    __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
              (&local_a0);
  }
  std::vector<long,_std::allocator<long>_>::~vector(this);
  return;
}

Assistant:

void checkShrinkExplosions_PairIntegral() {
  std::vector<IntegralType> fixtures = {
      IntegralType(1),
      IntegralType(-1),
      IntegralType(3),
      IntegralType(-3),
      IntegralType(100),
      IntegralType(5555),
      IntegralType(-5555),
      std::numeric_limits<IntegralType>::min(),
      std::numeric_limits<IntegralType>::max()};
  for (IntegralType a : fixtures) {
    for (IntegralType b : fixtures) {
      checkShrinkExplosions<std::pair<IntegralType, IntegralType>>(
          std::make_pair(a, b), [](std::pair<IntegralType, IntegralType> x) {
            return Arbitrary<std::pair<IntegralType, IntegralType>>::shrink(x);
          });
    }
  }
}